

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O2

int jsons_print_model(lyout *out,lys_module *module,char *target_schema_path)

{
  byte bVar1;
  int iVar2;
  int *first;
  int *first_00;
  int *first_01;
  char *pcVar3;
  
  if (target_schema_path == (char *)0x0) {
    bVar1 = module->field_0x40;
    ly_print(out,"{\"%s\":{",module->name);
    if ((bVar1 & 1) == 0) {
      ly_print(out,"\"namespace\":\"%s\"",module->ns);
      ly_print(out,",\"prefix\":\"%s\"",module->prefix);
      jsons_print_text(out,"description","text",module->dsc,1,(int *)0x0);
      jsons_print_text(out,"reference","text",module->ref,1,(int *)0x0);
      jsons_print_text(out,"organization","text",module->org,1,(int *)0x0);
      jsons_print_text(out,"contact","text",module->contact,1,(int *)0x0);
      pcVar3 = "1.0";
      if ((*(ushort *)&module->field_0x40 & 0xe) == 4) {
        pcVar3 = "1.1";
      }
      jsons_print_object(out,"yang-version","value",pcVar3,1,(int *)0x0);
      jsons_print_revisions(out,module->rev,module->rev_size,(int *)pcVar3);
      jsons_print_includes(out,module->inc,module->inc_size,(int *)pcVar3);
      jsons_print_imports(out,module,first);
      jsons_print_typedefs(out,module->tpdf,(uint8_t)module->tpdf_size,(int *)pcVar3);
      jsons_print_identities(out,module->ident,module->ident_size,(int *)pcVar3);
      jsons_print_features(out,module->features,module->features_size,(int *)pcVar3);
      jsons_print_augment(out,module->augment,module->augment_size,(int *)pcVar3);
      jsons_print_deviation(out,module->deviation,module->deviation_size,(int *)pcVar3);
      jsons_print_groupings(out,module->data,first_00);
      jsons_print_data(out,module,module->data,(int *)0x0);
      jsons_print_nodes_(out,module->data,"rpcs",0x100,(int *)0x0);
      jsons_print_notifs(out,module->data,(int *)0x0);
    }
    else {
      ly_print(out,"\"belongs-to\":\"%s\"",module->data->dsc);
      jsons_print_text(out,"description","text",module->dsc,1,(int *)0x0);
      jsons_print_text(out,"reference","text",module->ref,1,(int *)0x0);
      jsons_print_text(out,"organization","text",module->org,1,(int *)0x0);
      jsons_print_text(out,"contact","text",module->contact,1,(int *)0x0);
      pcVar3 = "1.0";
      if ((module->field_0x40 & 0xe) == 4) {
        pcVar3 = "1.1";
      }
      jsons_print_object(out,"yang-version","value",pcVar3,1,(int *)0x0);
      jsons_print_revisions(out,module->rev,module->rev_size,(int *)pcVar3);
      jsons_print_includes(out,module->inc,module->inc_size,(int *)pcVar3);
      jsons_print_imports(out,module,first_01);
      jsons_print_typedefs(out,module->tpdf,(uint8_t)module->tpdf_size,(int *)pcVar3);
      jsons_print_identities(out,module->ident,module->ident_size,(int *)pcVar3);
      jsons_print_features(out,module->features,module->features_size,(int *)pcVar3);
      jsons_print_augment(out,module->augment,module->augment_size,(int *)pcVar3);
      jsons_print_deviation(out,module->deviation,module->deviation_size,(int *)pcVar3);
    }
    iVar2 = 0;
    pcVar3 = "}}";
  }
  else {
    ly_print(out,"{");
    iVar2 = lys_print_target(out,module,target_schema_path,jsons_print_typedef,jsons_print_identity,
                             jsons_print_feature,jsons_print_type,jsons_print_grouping,
                             jsons_print_container,jsons_print_choice,jsons_print_leaf,
                             jsons_print_leaflist,jsons_print_list,jsons_print_anydata,
                             jsons_print_case,jsons_print_notif,jsons_print_rpc,jsons_print_action,
                             jsons_print_input,jsons_print_output);
    pcVar3 = "}";
  }
  ly_print(out,pcVar3);
  ly_print_flush(out);
  return iVar2;
}

Assistant:

int
jsons_print_model(struct lyout *out, const struct lys_module *module, const char *target_schema_path)
{
    int rc = EXIT_SUCCESS;

    if (!target_schema_path) {
        if (module->type == 0) {
            jsons_print_module(out, module);
        } else {
            jsons_print_submodule(out, (struct lys_submodule *)module);
        }
    } else {
        ly_print(out, "{");
        rc = lys_print_target(out, module, target_schema_path,
                              jsons_print_typedef,
                              jsons_print_identity,
                              jsons_print_feature,
                              jsons_print_type,
                              jsons_print_grouping,
                              jsons_print_container,
                              jsons_print_choice,
                              jsons_print_leaf,
                              jsons_print_leaflist,
                              jsons_print_list,
                              jsons_print_anydata,
                              jsons_print_case,
                              jsons_print_notif,
                              jsons_print_rpc,
                              jsons_print_action,
                              jsons_print_input,
                              jsons_print_output);
        ly_print(out, "}");
    }
    ly_print_flush(out);

    return rc;
}